

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
InternalGetPropertyRecord
          (ScriptContext *scriptContext,RecyclableObject *key,PropertyRecord **propertyRecord)

{
  code *pcVar1;
  bool bVar2;
  TypeId TVar3;
  undefined4 *puVar4;
  JavascriptString *propertyString;
  JavascriptSymbol *this;
  PropertyRecord *pPVar5;
  PropertyRecord **propertyRecord_local;
  RecyclableObject *key_local;
  ScriptContext *scriptContext_local;
  
  if (propertyRecord == (PropertyRecord **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x5d4,"(propertyRecord != nullptr)","propertyRecord != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  *propertyRecord = (PropertyRecord *)0x0;
  TVar3 = Js::RecyclableObject::GetTypeId(key);
  if (TVar3 == TypeIds_String) {
    propertyString = Js::VarTo<Js::JavascriptString,Js::RecyclableObject>(key);
    Js::ScriptContext::GetOrAddPropertyRecord(scriptContext,propertyString,propertyRecord);
  }
  else {
    if (TVar3 != TypeIds_Symbol) {
      return JsErrorInvalidArgument;
    }
    this = Js::VarTo<Js::JavascriptSymbol,Js::RecyclableObject>(key);
    pPVar5 = Js::JavascriptSymbol::GetValue(this);
    *propertyRecord = pPVar5;
  }
  return JsNoError;
}

Assistant:

static JsErrorCode InternalGetPropertyRecord(Js::ScriptContext * scriptContext,
    Js::RecyclableObject * key, _Out_ const Js::PropertyRecord ** propertyRecord)
{
    Assert(propertyRecord != nullptr);
    *propertyRecord = nullptr;

    switch(key->GetTypeId())
    {
    case Js::TypeIds_String:
        scriptContext->GetOrAddPropertyRecord(Js::VarTo<Js::JavascriptString>(key),
            (Js::PropertyRecord const **)propertyRecord);
        break;
    case Js::TypeIds_Symbol:
        *propertyRecord = Js::VarTo<Js::JavascriptSymbol>(key)->GetValue();
        break;
    default:
        return JsErrorInvalidArgument;
    };

    return JsNoError;
}